

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_blob_open(sqlite3 *db,char *zDb,char *zTable,char *zColumn,sqlite_int64 iRow,int flags,
                     sqlite3_blob **ppBlob)

{
  uint uVar1;
  uint val;
  int iVar2;
  sqlite3 *pParse_00;
  Parse *pParse_01;
  Table *iRow_00;
  Vdbe *pVVar3;
  char *in_RCX;
  undefined8 in_RDX;
  char *pcVar4;
  sqlite3 *in_RDI;
  int in_R9D;
  int iDb;
  Vdbe *v;
  int j_1;
  int j;
  FKey *pFKey;
  Index *pIdx;
  char *zFault;
  Incrblob *pBlob;
  Parse *pParse;
  Table *pTab;
  char *zErr;
  int rc;
  int iCol;
  int nAttempt;
  uint in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  sqlite3 *in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  Vdbe *in_stack_ffffffffffffff90;
  FKey *pFVar5;
  Parse *in_stack_ffffffffffffff98;
  Index *pIVar6;
  Vdbe *in_stack_ffffffffffffffa0;
  Incrblob *p;
  uint local_38;
  int local_34;
  int local_30;
  
  local_30 = 0;
  local_38 = 0;
  p = (Incrblob *)0x0;
  v->db = (sqlite3 *)0x0;
  val = (uint)(in_R9D != 0);
  sqlite3_mutex_enter((sqlite3_mutex *)0x117610);
  pParse_00 = (sqlite3 *)
              sqlite3DbMallocZero(in_stack_ffffffffffffff80,
                                  CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  if ((pParse_00 != (sqlite3 *)0x0) &&
     (pParse_01 = (Parse *)sqlite3DbMallocRaw((sqlite3 *)
                                              CONCAT44(in_stack_ffffffffffffff8c,
                                                       in_stack_ffffffffffffff88),
                                              (u64)in_stack_ffffffffffffff80),
     pParse_01 != (Parse *)0x0)) {
    do {
      memset(pParse_01,0,0x288);
      pParse_01->db = in_RDI;
      sqlite3DbFree(in_stack_ffffffffffffff80,
                    (void *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      p = (Incrblob *)0x0;
      sqlite3BtreeEnterAll(in_stack_ffffffffffffff80);
      iRow_00 = sqlite3LocateTable(in_stack_ffffffffffffff98,
                                   (int)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                                   (char *)CONCAT44(in_stack_ffffffffffffff8c,
                                                    in_stack_ffffffffffffff88),
                                   (char *)in_stack_ffffffffffffff80);
      if ((iRow_00 != (Table *)0x0) && ((iRow_00->tabFlags & 0x10) != 0)) {
        iRow_00 = (Table *)0x0;
        sqlite3ErrorMsg(pParse_01,"cannot open virtual table: %s",in_RDX);
      }
      if ((iRow_00 != (Table *)0x0) && ((iRow_00->tabFlags & 0x20) != 0)) {
        iRow_00 = (Table *)0x0;
        sqlite3ErrorMsg(pParse_01,"cannot open table without rowid: %s",in_RDX);
      }
      if ((iRow_00 != (Table *)0x0) && (iRow_00->pSelect != (Select *)0x0)) {
        iRow_00 = (Table *)0x0;
        sqlite3ErrorMsg(pParse_01,"cannot open view: %s",in_RDX);
      }
      if (iRow_00 == (Table *)0x0) {
        if (pParse_01->zErrMsg != (char *)0x0) {
          sqlite3DbFree(in_stack_ffffffffffffff80,
                        (void *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
          p = (Incrblob *)pParse_01->zErrMsg;
          pParse_01->zErrMsg = (char *)0x0;
        }
        local_38 = 1;
        sqlite3BtreeLeaveAll(in_stack_ffffffffffffff80);
        break;
      }
      local_34 = 0;
      while ((local_34 < iRow_00->nCol &&
             (iVar2 = sqlite3_stricmp(iRow_00->aCol[local_34].zName,in_RCX), iVar2 != 0))) {
        local_34 = local_34 + 1;
      }
      if (local_34 == iRow_00->nCol) {
        sqlite3DbFree(in_stack_ffffffffffffff80,
                      (void *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
        p = (Incrblob *)sqlite3MPrintf(in_RDI,"no such column: \"%s\"",in_RCX);
        local_38 = 1;
        sqlite3BtreeLeaveAll(in_stack_ffffffffffffff80);
        break;
      }
      if (val != 0) {
        pcVar4 = (char *)0x0;
        if ((in_RDI->flags & 0x80000U) != 0) {
          for (pFVar5 = iRow_00->pFKey; pFVar5 != (FKey *)0x0; pFVar5 = pFVar5->pNextFrom) {
            for (in_stack_ffffffffffffff8c = 0; in_stack_ffffffffffffff8c < pFVar5->nCol;
                in_stack_ffffffffffffff8c = in_stack_ffffffffffffff8c + 1) {
              if (pFVar5->aCol[in_stack_ffffffffffffff8c].iFrom == local_34) {
                pcVar4 = "foreign key";
              }
            }
          }
          in_stack_ffffffffffffff90 = (Vdbe *)0x0;
        }
        for (pIVar6 = iRow_00->pIndex; pIVar6 != (Index *)0x0; pIVar6 = pIVar6->pNext) {
          for (in_stack_ffffffffffffff88 = 0; in_stack_ffffffffffffff88 < (int)(uint)pIVar6->nKeyCol
              ; in_stack_ffffffffffffff88 = in_stack_ffffffffffffff88 + 1) {
            if (pIVar6->aiColumn[in_stack_ffffffffffffff88] == local_34) {
              pcVar4 = "indexed";
            }
          }
        }
        if (pcVar4 != (char *)0x0) {
          sqlite3DbFree(in_stack_ffffffffffffff80,
                        (void *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
          p = (Incrblob *)sqlite3MPrintf(in_RDI,"cannot open %s column for writing",pcVar4);
          local_38 = 1;
          sqlite3BtreeLeaveAll(in_stack_ffffffffffffff80);
          break;
        }
        in_stack_ffffffffffffff98 = (Parse *)0x0;
        in_stack_ffffffffffffffa0 = (Vdbe *)0x0;
      }
      pVVar3 = sqlite3VdbeCreate((Parse *)CONCAT44(in_stack_ffffffffffffff8c,
                                                   in_stack_ffffffffffffff88));
      pParse_00->mutex = (sqlite3_mutex *)pVVar3;
      if (pParse_00->mutex != (sqlite3_mutex *)0x0) {
        in_stack_ffffffffffffff80 = (sqlite3 *)pParse_00->mutex;
        in_stack_ffffffffffffff7c = sqlite3SchemaToIndex(in_RDI,iRow_00->pSchema);
        sqlite3VdbeAddOp4Int
                  (in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88,
                   (int)((ulong)in_stack_ffffffffffffff80 >> 0x20),(int)in_stack_ffffffffffffff80,
                   in_stack_ffffffffffffff7c);
        sqlite3VdbeChangeP5((Vdbe *)in_stack_ffffffffffffff80,'\x01');
        sqlite3VdbeAddOpList
                  ((Vdbe *)pParse_00,(int)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
                   (VdbeOpList *)in_stack_ffffffffffffff98,
                   (int)((ulong)in_stack_ffffffffffffff90 >> 0x20));
        sqlite3VdbeUsesBtree((Vdbe *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
        sqlite3VdbeChangeP1((Vdbe *)in_stack_ffffffffffffff80,1,in_stack_ffffffffffffff7c);
        sqlite3VdbeChangeP2((Vdbe *)in_stack_ffffffffffffff80,1,iRow_00->tnum);
        sqlite3VdbeChangeP3((Vdbe *)in_stack_ffffffffffffff80,1,val);
        sqlite3VdbeChangeP4(in_stack_ffffffffffffffa0,
                            (int)((ulong)in_stack_ffffffffffffff98 >> 0x20),
                            (char *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
        sqlite3VdbeChangeToNoop(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
        sqlite3VdbeChangeP2((Vdbe *)in_stack_ffffffffffffff80,val + 2,iRow_00->tnum);
        sqlite3VdbeChangeP3((Vdbe *)in_stack_ffffffffffffff80,val + 2,in_stack_ffffffffffffff7c);
        sqlite3VdbeChangeP4(in_stack_ffffffffffffffa0,
                            (int)((ulong)in_stack_ffffffffffffff98 >> 0x20),
                            (char *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
        sqlite3VdbeChangeP2((Vdbe *)in_stack_ffffffffffffff80,6,(int)iRow_00->nCol);
        if (in_RDI->mallocFailed == '\0') {
          pParse_01->nVar = 1;
          pParse_01->nMem = 1;
          pParse_01->nTab = 1;
          sqlite3VdbeMakeReady((Vdbe *)pParse_01,(Parse *)pParse_00);
        }
      }
      *(uint *)&pParse_00->pVfs = val;
      *(int *)((long)&pParse_00->pVdbe + 4) = local_34;
      pParse_00->aDb = (Db *)in_RDI;
      sqlite3BtreeLeaveAll(in_stack_ffffffffffffff80);
      if (in_RDI->mallocFailed != '\0') break;
      sqlite3_bind_int64((sqlite3_stmt *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,
                         (sqlite_int64)in_stack_ffffffffffffff80);
      local_38 = blobSeekToRow(p,(sqlite3_int64)iRow_00,(char **)pParse_01);
      local_30 = local_30 + 1;
      uVar1 = in_stack_ffffffffffffff78 & 0xffffff;
      if (local_30 < 0x32) {
        uVar1 = CONCAT13(local_38 == 0x11,(int3)in_stack_ffffffffffffff78);
      }
      in_stack_ffffffffffffff78 = uVar1;
    } while ((char)(in_stack_ffffffffffffff78 >> 0x18) != '\0');
  }
  if ((local_38 == 0) && (in_RDI->mallocFailed == '\0')) {
    v->db = pParse_00;
  }
  else {
    if ((pParse_00 != (sqlite3 *)0x0) && (pParse_00->mutex != (sqlite3_mutex *)0x0)) {
      sqlite3VdbeFinalize((Vdbe *)in_stack_ffffffffffffff80);
    }
    sqlite3DbFree(in_stack_ffffffffffffff80,
                  (void *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  }
  pcVar4 = (char *)0x0;
  if (p != (Incrblob *)0x0) {
    pcVar4 = "%s";
  }
  sqlite3ErrorWithMsg(in_RDI,(int)(ulong)local_38,pcVar4,p);
  sqlite3DbFree(in_stack_ffffffffffffff80,
                (void *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  sqlite3ParserReset((Parse *)in_stack_ffffffffffffff80);
  sqlite3DbFree(in_stack_ffffffffffffff80,
                (void *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  iVar2 = sqlite3ApiExit((sqlite3 *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),0)
  ;
  sqlite3_mutex_leave((sqlite3_mutex *)0x117d2f);
  return iVar2;
}

Assistant:

SQLITE_STDCALL sqlite3_blob_open(
  sqlite3* db,            /* The database connection */
  const char *zDb,        /* The attached database containing the blob */
  const char *zTable,     /* The table containing the blob */
  const char *zColumn,    /* The column containing the blob */
  sqlite_int64 iRow,      /* The row containing the glob */
  int flags,              /* True -> read/write access, false -> read-only */
  sqlite3_blob **ppBlob   /* Handle for accessing the blob returned here */
){
  int nAttempt = 0;
  int iCol;               /* Index of zColumn in row-record */

  /* This VDBE program seeks a btree cursor to the identified 
  ** db/table/row entry. The reason for using a vdbe program instead
  ** of writing code to use the b-tree layer directly is that the
  ** vdbe program will take advantage of the various transaction,
  ** locking and error handling infrastructure built into the vdbe.
  **
  ** After seeking the cursor, the vdbe executes an OP_ResultRow.
  ** Code external to the Vdbe then "borrows" the b-tree cursor and
  ** uses it to implement the blob_read(), blob_write() and 
  ** blob_bytes() functions.
  **
  ** The sqlite3_blob_close() function finalizes the vdbe program,
  ** which closes the b-tree cursor and (possibly) commits the 
  ** transaction.
  */
  static const int iLn = VDBE_OFFSET_LINENO(4);
  static const VdbeOpList openBlob[] = {
    /* {OP_Transaction, 0, 0, 0},  // 0: Inserted separately */
    {OP_TableLock, 0, 0, 0},       /* 1: Acquire a read or write lock */
    /* One of the following two instructions is replaced by an OP_Noop. */
    {OP_OpenRead, 0, 0, 0},        /* 2: Open cursor 0 for reading */
    {OP_OpenWrite, 0, 0, 0},       /* 3: Open cursor 0 for read/write */
    {OP_Variable, 1, 1, 1},        /* 4: Push the rowid to the stack */
    {OP_NotExists, 0, 10, 1},      /* 5: Seek the cursor */
    {OP_Column, 0, 0, 1},          /* 6  */
    {OP_ResultRow, 1, 0, 0},       /* 7  */
    {OP_Goto, 0, 4, 0},            /* 8  */
    {OP_Close, 0, 0, 0},           /* 9  */
    {OP_Halt, 0, 0, 0},            /* 10 */
  };

  int rc = SQLITE_OK;
  char *zErr = 0;
  Table *pTab;
  Parse *pParse = 0;
  Incrblob *pBlob = 0;

#ifdef SQLITE_ENABLE_API_ARMOR
  if( ppBlob==0 ){
    return SQLITE_MISUSE_BKPT;
  }
#endif
  *ppBlob = 0;
#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) || zTable==0 ){
    return SQLITE_MISUSE_BKPT;
  }
#endif
  flags = !!flags;                /* flags = (flags ? 1 : 0); */

  sqlite3_mutex_enter(db->mutex);

  pBlob = (Incrblob *)sqlite3DbMallocZero(db, sizeof(Incrblob));
  if( !pBlob ) goto blob_open_out;
  pParse = sqlite3StackAllocRaw(db, sizeof(*pParse));
  if( !pParse ) goto blob_open_out;

  do {
    memset(pParse, 0, sizeof(Parse));
    pParse->db = db;
    sqlite3DbFree(db, zErr);
    zErr = 0;

    sqlite3BtreeEnterAll(db);
    pTab = sqlite3LocateTable(pParse, 0, zTable, zDb);
    if( pTab && IsVirtual(pTab) ){
      pTab = 0;
      sqlite3ErrorMsg(pParse, "cannot open virtual table: %s", zTable);
    }
    if( pTab && !HasRowid(pTab) ){
      pTab = 0;
      sqlite3ErrorMsg(pParse, "cannot open table without rowid: %s", zTable);
    }
#ifndef SQLITE_OMIT_VIEW
    if( pTab && pTab->pSelect ){
      pTab = 0;
      sqlite3ErrorMsg(pParse, "cannot open view: %s", zTable);
    }
#endif
    if( !pTab ){
      if( pParse->zErrMsg ){
        sqlite3DbFree(db, zErr);
        zErr = pParse->zErrMsg;
        pParse->zErrMsg = 0;
      }
      rc = SQLITE_ERROR;
      sqlite3BtreeLeaveAll(db);
      goto blob_open_out;
    }

    /* Now search pTab for the exact column. */
    for(iCol=0; iCol<pTab->nCol; iCol++) {
      if( sqlite3StrICmp(pTab->aCol[iCol].zName, zColumn)==0 ){
        break;
      }
    }
    if( iCol==pTab->nCol ){
      sqlite3DbFree(db, zErr);
      zErr = sqlite3MPrintf(db, "no such column: \"%s\"", zColumn);
      rc = SQLITE_ERROR;
      sqlite3BtreeLeaveAll(db);
      goto blob_open_out;
    }

    /* If the value is being opened for writing, check that the
    ** column is not indexed, and that it is not part of a foreign key. 
    ** It is against the rules to open a column to which either of these
    ** descriptions applies for writing.  */
    if( flags ){
      const char *zFault = 0;
      Index *pIdx;
#ifndef SQLITE_OMIT_FOREIGN_KEY
      if( db->flags&SQLITE_ForeignKeys ){
        /* Check that the column is not part of an FK child key definition. It
        ** is not necessary to check if it is part of a parent key, as parent
        ** key columns must be indexed. The check below will pick up this 
        ** case.  */
        FKey *pFKey;
        for(pFKey=pTab->pFKey; pFKey; pFKey=pFKey->pNextFrom){
          int j;
          for(j=0; j<pFKey->nCol; j++){
            if( pFKey->aCol[j].iFrom==iCol ){
              zFault = "foreign key";
            }
          }
        }
      }
#endif
      for(pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext){
        int j;
        for(j=0; j<pIdx->nKeyCol; j++){
          if( pIdx->aiColumn[j]==iCol ){
            zFault = "indexed";
          }
        }
      }
      if( zFault ){
        sqlite3DbFree(db, zErr);
        zErr = sqlite3MPrintf(db, "cannot open %s column for writing", zFault);
        rc = SQLITE_ERROR;
        sqlite3BtreeLeaveAll(db);
        goto blob_open_out;
      }
    }

    pBlob->pStmt = (sqlite3_stmt *)sqlite3VdbeCreate(pParse);
    assert( pBlob->pStmt || db->mallocFailed );
    if( pBlob->pStmt ){
      Vdbe *v = (Vdbe *)pBlob->pStmt;
      int iDb = sqlite3SchemaToIndex(db, pTab->pSchema);


      sqlite3VdbeAddOp4Int(v, OP_Transaction, iDb, flags, 
                           pTab->pSchema->schema_cookie,
                           pTab->pSchema->iGeneration);
      sqlite3VdbeChangeP5(v, 1);     
      sqlite3VdbeAddOpList(v, ArraySize(openBlob), openBlob, iLn);

      /* Make sure a mutex is held on the table to be accessed */
      sqlite3VdbeUsesBtree(v, iDb); 

      /* Configure the OP_TableLock instruction */
#ifdef SQLITE_OMIT_SHARED_CACHE
      sqlite3VdbeChangeToNoop(v, 1);
#else
      sqlite3VdbeChangeP1(v, 1, iDb);
      sqlite3VdbeChangeP2(v, 1, pTab->tnum);
      sqlite3VdbeChangeP3(v, 1, flags);
      sqlite3VdbeChangeP4(v, 1, pTab->zName, P4_TRANSIENT);
#endif

      /* Remove either the OP_OpenWrite or OpenRead. Set the P2 
      ** parameter of the other to pTab->tnum.  */
      sqlite3VdbeChangeToNoop(v, 3 - flags);
      sqlite3VdbeChangeP2(v, 2 + flags, pTab->tnum);
      sqlite3VdbeChangeP3(v, 2 + flags, iDb);

      /* Configure the number of columns. Configure the cursor to
      ** think that the table has one more column than it really
      ** does. An OP_Column to retrieve this imaginary column will
      ** always return an SQL NULL. This is useful because it means
      ** we can invoke OP_Column to fill in the vdbe cursors type 
      ** and offset cache without causing any IO.
      */
      sqlite3VdbeChangeP4(v, 2+flags, SQLITE_INT_TO_PTR(pTab->nCol+1),P4_INT32);
      sqlite3VdbeChangeP2(v, 6, pTab->nCol);
      if( !db->mallocFailed ){
        pParse->nVar = 1;
        pParse->nMem = 1;
        pParse->nTab = 1;
        sqlite3VdbeMakeReady(v, pParse);
      }
    }
   
    pBlob->flags = flags;
    pBlob->iCol = iCol;
    pBlob->db = db;
    sqlite3BtreeLeaveAll(db);
    if( db->mallocFailed ){
      goto blob_open_out;
    }
    sqlite3_bind_int64(pBlob->pStmt, 1, iRow);
    rc = blobSeekToRow(pBlob, iRow, &zErr);
  } while( (++nAttempt)<SQLITE_MAX_SCHEMA_RETRY && rc==SQLITE_SCHEMA );

blob_open_out:
  if( rc==SQLITE_OK && db->mallocFailed==0 ){
    *ppBlob = (sqlite3_blob *)pBlob;
  }else{
    if( pBlob && pBlob->pStmt ) sqlite3VdbeFinalize((Vdbe *)pBlob->pStmt);
    sqlite3DbFree(db, pBlob);
  }
  sqlite3ErrorWithMsg(db, rc, (zErr ? "%s" : 0), zErr);
  sqlite3DbFree(db, zErr);
  sqlite3ParserReset(pParse);
  sqlite3StackFree(db, pParse);
  rc = sqlite3ApiExit(db, rc);
  sqlite3_mutex_leave(db->mutex);
  return rc;
}